

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestDivideModuloIntBignum(void)

{
  Bignum third;
  Bignum other;
  Bignum bignum;
  char buffer [1024];
  undefined4 in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5ec;
  Bignum *in_stack_fffffffffffff5f0;
  Chunk in_stack_fffffffffffff5f8;
  undefined2 in_stack_fffffffffffff5fc;
  uint16_t in_stack_fffffffffffff5fe;
  Bignum *in_stack_fffffffffffff600;
  Chunk in_stack_fffffffffffff608;
  Chunk in_stack_fffffffffffff60c;
  Bignum *in_stack_fffffffffffff610;
  Chunk in_stack_fffffffffffff618;
  uint32_t in_stack_fffffffffffff61c;
  Bignum *in_stack_fffffffffffff620;
  Bignum *in_stack_fffffffffffff628;
  Bignum *in_stack_fffffffffffff638;
  Bignum *in_stack_fffffffffffff640;
  Bignum local_810;
  Bignum local_60c [3];
  
  double_conversion::Bignum::Bignum(local_60c);
  double_conversion::Bignum::Bignum(&local_810);
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff5ec);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::AssignBignum
            (in_stack_fffffffffffff600,
             (Bignum *)
             CONCAT26(in_stack_fffffffffffff5fe,
                      CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)));
  double_conversion::Bignum::MultiplyByUInt32(in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  AssignHexString(in_stack_fffffffffffff610,
                  (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::AssignBignum
            (in_stack_fffffffffffff600,
             (Bignum *)
             CONCAT26(in_stack_fffffffffffff5fe,
                      CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)));
  double_conversion::Bignum::MultiplyByUInt32(in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff600,in_stack_fffffffffffff5fe);
  double_conversion::Bignum::SubtractBignum
            (in_stack_fffffffffffff620,
             (Bignum *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  double_conversion::Bignum::DivideModuloIntBignum
            (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
                    (char *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff628,(char *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
  CheckHelper((char *)in_stack_fffffffffffff600,
              CONCAT22(in_stack_fffffffffffff5fe,in_stack_fffffffffffff5fc),
              (char *)in_stack_fffffffffffff5f0,SUB41((uint)in_stack_fffffffffffff5ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff610,in_stack_fffffffffffff60c,
                    (char *)in_stack_fffffffffffff600,
                    (char *)CONCAT26(in_stack_fffffffffffff5fe,
                                     CONCAT24(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)),
                    (char *)in_stack_fffffffffffff5f0,
                    (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  return;
}

Assistant:

TEST(DivideModuloIntBignum) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum other;
  Bignum third;

  bignum.AssignUInt16(10);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(11);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(1);
  bignum.AddBignum(other);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  bignum.AddBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFF", buffer);

  bignum.AssignUInt16(10);
  AssignHexString(&other, "1234567890");
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "12345678");
  AssignHexString(&other, "3789012");
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("D9861E", buffer);

  AssignHexString(&bignum, "70000001");
  AssignHexString(&other, "1FFFFFFF");
  CHECK_EQ(3, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000004", buffer);

  AssignHexString(&bignum, "28000000");
  AssignHexString(&other, "12A05F20");
  CHECK_EQ(2, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2BF41C0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  other.SubtractBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
}